

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[95]>(String *__return_storage_ptr__,kj *this,char (*params) [95])

{
  ArrayPtr<const_char> local_18;
  
  local_18 = toCharSequence<char_const(&)[95]>((char (*) [95])this);
  _::concat<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_18,(ArrayPtr<const_char> *)local_18.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}